

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcShaderIntegerMixTests.cpp
# Opt level: O0

qpTestResult __thiscall
deqp::ShaderIntegerMixPrototypesCase::test(ShaderIntegerMixPrototypesCase *this)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  TestLog *this_00;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  ContextInfo *this_01;
  char *pcVar6;
  mapped_type *pmVar7;
  char local_558 [8];
  GLchar infoLog [1000];
  char *pcStack_168;
  GLint compileSuccess;
  char *strings [1];
  GLuint shader;
  StringTemplate local_138;
  undefined1 local_118 [8];
  string code;
  key_type local_f0;
  allocator<char> local_c9;
  key_type local_c8;
  allocator<char> local_a1;
  key_type local_a0;
  undefined1 local_70 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  args;
  char *pcStack_38;
  int i;
  char *extension_enable;
  GLSLVersion v;
  bool pass;
  Functions *gl;
  TestLog *log;
  ShaderIntegerMixPrototypesCase *this_local;
  long lVar5;
  
  this_00 = tcu::TestContext::getLog
                      ((this->super_ShaderIntegerMixCase).super_TestCase.super_TestCase.
                       super_TestNode.m_testCtx);
  pRVar4 = deqp::Context::getRenderContext
                     ((this->super_ShaderIntegerMixCase).super_TestCase.m_context);
  iVar3 = (*pRVar4->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar3);
  bVar1 = true;
  if (((this->super_ShaderIntegerMixCase).field_0x7c & 1) == 0) {
    extension_enable._0_4_ = (this->super_ShaderIntegerMixCase).m_glslVersion;
    pcStack_38 = "";
    if ((int)(this->super_ShaderIntegerMixCase).m_glslVersion < 2) {
      return QP_TEST_RESULT_NOT_SUPPORTED;
    }
  }
  else {
    bVar2 = glu::glslVersionIsES((this->super_ShaderIntegerMixCase).m_glslVersion);
    extension_enable._0_4_ = GLSL_VERSION_330;
    if (bVar2) {
      extension_enable._0_4_ = GLSL_VERSION_300_ES;
    }
    pcStack_38 = "#extension GL_EXT_shader_integer_mix: enable";
    this_01 = deqp::Context::getContextInfo
                        ((this->super_ShaderIntegerMixCase).super_TestCase.m_context);
    bVar2 = glu::ContextInfo::isExtensionSupported(this_01,"GL_EXT_shader_integer_mix");
    if (!bVar2) {
      return QP_TEST_RESULT_NOT_SUPPORTED;
    }
  }
  for (args._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 0;
      args._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ < 2;
      args._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ =
           args._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ + 1) {
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)local_70);
    pcVar6 = glu::getGLSLVersionDeclaration((GLSLVersion)extension_enable);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"VERSION_DECL",&local_a1)
    ;
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_70,&local_a0);
    std::__cxx11::string::operator=((string *)pmVar7,pcVar6);
    std::__cxx11::string::~string((string *)&local_a0);
    std::allocator<char>::~allocator(&local_a1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,"EXTENSION_ENABLE",&local_c9);
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_70,&local_c8);
    std::__cxx11::string::operator=((string *)pmVar7,pcStack_38);
    std::__cxx11::string::~string((string *)&local_c8);
    std::allocator<char>::~allocator(&local_c9);
    pcVar6 = test::shader_targets[args._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_].body;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f0,"BODY",(allocator<char> *)(code.field_2._M_local_buf + 0xf));
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_70,&local_f0);
    std::__cxx11::string::operator=((string *)pmVar7,pcVar6);
    std::__cxx11::string::~string((string *)&local_f0);
    std::allocator<char>::~allocator((allocator<char> *)(code.field_2._M_local_buf + 0xf));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&shader,
               "${VERSION_DECL}\n${EXTENSION_ENABLE}\n\nvoid main()\n{\n\tmix(ivec2(1), ivec2(2), bvec2(true));\n\tmix(ivec3(1), ivec3(2), bvec3(true));\n\tmix(ivec4(1), ivec4(2), bvec4(true));\n\tmix(uvec2(1), uvec2(2), bvec2(true));\n\tmix(uvec3(1), uvec3(2), bvec3(true));\n\tmix(uvec4(1), uvec4(2), bvec4(true));\n\tmix(bvec2(1), bvec2(0), bvec2(true));\n\tmix(bvec3(1), bvec3(0), bvec3(true));\n\tmix(bvec4(1), bvec4(0), bvec4(true));\n\t${BODY}\n}\n"
               ,(allocator<char> *)((long)strings + 7));
    tcu::StringTemplate::StringTemplate(&local_138,(string *)&shader);
    tcu::StringTemplate::specialize
              ((string *)local_118,&local_138,
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)local_70);
    tcu::StringTemplate::~StringTemplate(&local_138);
    std::__cxx11::string::~string((string *)&shader);
    std::allocator<char>::~allocator((allocator<char> *)((long)strings + 7));
    strings[0]._0_4_ =
         (**(code **)(lVar5 + 0x3f0))
                   (test::shader_targets
                    [args._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_].target);
    pcStack_168 = (char *)std::__cxx11::string::c_str();
    (**(code **)(lVar5 + 0x12b8))(strings[0]._0_4_,1,&stack0xfffffffffffffe98);
    (**(code **)(lVar5 + 0x248))(strings[0]._0_4_);
    infoLog[0x3e4] = '\0';
    infoLog[0x3e5] = '\0';
    infoLog[0x3e6] = '\0';
    infoLog[999] = '\0';
    (**(code **)(lVar5 + 0xa70))(strings[0]._0_4_,0x8b81,infoLog + 0x3e4);
    if (infoLog._996_4_ == 0) {
      (**(code **)(lVar5 + 0xa58))(strings[0]._0_4_,1000,0);
      tcu::TestLog::writeKernelSource(this_00,pcStack_168);
      tcu::TestLog::writeCompileInfo(this_00,"shader","",false,local_558);
      bVar1 = false;
    }
    (**(code **)(lVar5 + 0x470))(strings[0]._0_4_);
    std::__cxx11::string::~string((string *)local_118);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)local_70);
  }
  return (uint)!bVar1;
}

Assistant:

virtual qpTestResult test()
	{
		TestLog&			  log  = m_testCtx.getLog();
		const glw::Functions& gl   = m_context.getRenderContext().getFunctions();
		bool				  pass = true;

		static const char source_template[] = "${VERSION_DECL}\n"
											  "${EXTENSION_ENABLE}\n"
											  "\n"
											  "void main()\n"
											  "{\n"
											  "	mix(ivec2(1), ivec2(2), bvec2(true));\n"
											  "	mix(ivec3(1), ivec3(2), bvec3(true));\n"
											  "	mix(ivec4(1), ivec4(2), bvec4(true));\n"
											  "	mix(uvec2(1), uvec2(2), bvec2(true));\n"
											  "	mix(uvec3(1), uvec3(2), bvec3(true));\n"
											  "	mix(uvec4(1), uvec4(2), bvec4(true));\n"
											  "	mix(bvec2(1), bvec2(0), bvec2(true));\n"
											  "	mix(bvec3(1), bvec3(0), bvec3(true));\n"
											  "	mix(bvec4(1), bvec4(0), bvec4(true));\n"
											  "	${BODY}\n"
											  "}\n";

		static const struct
		{
			GLenum		target;
			const char* body;
		} shader_targets[] = {
			{ GL_VERTEX_SHADER, "gl_Position = vec4(0);" }, { GL_FRAGMENT_SHADER, "" },
		};

		glu::GLSLVersion v;
		const char*		 extension_enable;

		if (use_extension)
		{
			v				 = glslVersionIsES(m_glslVersion) ? glu::GLSL_VERSION_300_ES : glu::GLSL_VERSION_330;
			extension_enable = "#extension GL_EXT_shader_integer_mix: enable";

			if (!m_context.getContextInfo().isExtensionSupported("GL_EXT_shader_integer_mix"))
				return QP_TEST_RESULT_NOT_SUPPORTED;
		}
		else
		{
			v				 = m_glslVersion;
			extension_enable = "";

			if (m_glslVersion < glu::GLSL_VERSION_310_ES)
				return QP_TEST_RESULT_NOT_SUPPORTED;
		}

		for (int i = 0; i < DE_LENGTH_OF_ARRAY(shader_targets); i++)
		{
			std::map<std::string, std::string> args;

			args["VERSION_DECL"]	 = glu::getGLSLVersionDeclaration(v);
			args["EXTENSION_ENABLE"] = extension_enable;
			args["BODY"]			 = shader_targets[i].body;

			std::string code = tcu::StringTemplate(source_template).specialize(args);

			GLuint		shader	 = gl.createShader(shader_targets[i].target);
			char const* strings[1] = { code.c_str() };
			gl.shaderSource(shader, 1, strings, 0);
			gl.compileShader(shader);

			GLint compileSuccess = 0;
			gl.getShaderiv(shader, GL_COMPILE_STATUS, &compileSuccess);

			if (!compileSuccess)
			{
				GLchar infoLog[1000];

				gl.getShaderInfoLog(shader, sizeof(infoLog), NULL, infoLog);
				log.writeKernelSource(strings[0]);
				log.writeCompileInfo("shader", "", false, infoLog);

				pass = false;
			}

			gl.deleteShader(shader);
		}

		return pass ? QP_TEST_RESULT_PASS : QP_TEST_RESULT_FAIL;
	}